

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

Result_Type
chaiscript::
boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>*>
          (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *p_Var2;
  const_iterator cVar3;
  Result_Type pmVar4;
  bad_boxed_cast *this;
  undefined1 local_40 [24];
  key_type local_28;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_40._0_8_ =
         &std::
          map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>*
          ::typeinfo;
    local_40._8_8_ =
         &std::
          map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::typeinfo;
    local_40._16_4_ = 4;
    bVar1 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_40);
    if (!bVar1) {
      p_Var2 = &Type_Conversions::thread_cache((t_conversions->m_conversions)._M_data)->_M_t;
      local_28 = (key_type)
                 &std::
                  map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                  ::typeinfo;
      cVar3 = std::
              _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
              ::find(p_Var2,&local_28);
      if ((_Rb_tree_header *)cVar3._M_node != &(p_Var2->_M_impl).super__Rb_tree_header) {
        if (t_conversions != (Type_Conversions_State *)0x0) {
          p_Var2 = &Type_Conversions::thread_cache((t_conversions->m_conversions)._M_data)->_M_t;
          local_40._0_8_ =
               &std::
                map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                ::typeinfo;
          cVar3 = std::
                  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                  ::find(p_Var2,(key_type *)local_40);
          if ((_Rb_tree_header *)cVar3._M_node != &(p_Var2->_M_impl).super__Rb_tree_header) {
            Type_Conversions::
            boxed_type_conversion<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>*>
                      ((Type_Conversions *)local_40,
                       (Conversion_Saves *)(t_conversions->m_conversions)._M_data,
                       (Boxed_Value *)(t_conversions->m_saves)._M_data);
            pmVar4 = detail::
                     Cast_Helper_Inner<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_*>
                     ::cast((Boxed_Value *)local_40,t_conversions);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return pmVar4;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
            return pmVar4;
          }
        }
        this = (bad_boxed_cast *)__cxa_allocate_exception(0x48);
        exception::bad_boxed_cast::bad_boxed_cast
                  (this,((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,
                   (type_info *)
                   &std::
                    map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>*
                    ::typeinfo);
        __cxa_throw(this,&exception::bad_boxed_cast::typeinfo,
                    exception::bad_boxed_cast::~bad_boxed_cast);
      }
    }
  }
  pmVar4 = detail::
           Cast_Helper_Inner<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_*>
           ::cast(bv,t_conversions);
  return pmVar4;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr)
  {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }


    if (t_conversions && (*t_conversions)->convertable_type<Type>())
    {
      try {
        // std::cout << "trying an up conversion " << typeid(Type).name() << '\n';
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions);
      } catch (...) {
        try {
        //  std::cout << "trying a down conversion " << typeid(Type).name() << '\n';
          // try going the other way - down the inheritance graph
          return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv), t_conversions);
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not polymorphic, just throw the error, don't waste the time on the 
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }

  }